

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Abc_Obj_t * Abc_NodeFromGlobalBdds(Abc_Ntk_t *pNtkNew,DdManager *dd,DdNode *bFunc,int fReverse)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  DdNode *n;
  int i;
  long lVar1;
  
  pObj = Abc_NtkCreateNode(pNtkNew);
  for (lVar1 = 0; lVar1 < pNtkNew->vCis->nSize; lVar1 = lVar1 + 1) {
    Abc_NtkCi(pNtkNew,(int)lVar1);
    if (fReverse == 0) {
      i = dd->invperm[lVar1];
    }
    else {
      i = ~dd->invperm[lVar1] + pNtkNew->vCis->nSize;
    }
    pFanin = Abc_NtkCi(pNtkNew,i);
    Abc_ObjAddFanin(pObj,pFanin);
  }
  n = Extra_TransferLevelByLevel(dd,(DdManager *)pNtkNew->pManFunc,bFunc);
  (pObj->field_5).pData = n;
  Cudd_Ref(n);
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NodeFromGlobalBdds( Abc_Ntk_t * pNtkNew, DdManager * dd, DdNode * bFunc, int fReverse )
{
    Abc_Obj_t * pNodeNew, * pTemp;
    int i;
    // create a new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins in the order, in which they appear in the reordered manager
    Abc_NtkForEachCi( pNtkNew, pTemp, i )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, fReverse ? Abc_NtkCiNum(pNtkNew)-1-dd->invperm[i] : dd->invperm[i]) );
    // transfer the function
    pNodeNew->pData = Extra_TransferLevelByLevel( dd, (DdManager *)pNtkNew->pManFunc, bFunc );  Cudd_Ref( (DdNode *)pNodeNew->pData );
    return pNodeNew;
}